

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

int __thiscall
slang::SmallVectorBase<const_slang::ast::VariableSymbol_*>::copy
          (SmallVectorBase<const_slang::ast::VariableSymbol_*> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  VariableSymbol **__result;
  const_iterator __first;
  const_iterator __last;
  pointer dest;
  BumpAllocator *alloc_local;
  SmallVectorBase<const_slang::ast::VariableSymbol_*> *this_local;
  
  if (this->len == 0) {
    nonstd::span_lite::span<const_slang::ast::VariableSymbol_*,_18446744073709551615UL>::
    span<true,_0>((span<const_slang::ast::VariableSymbol_*,_18446744073709551615UL> *)&this_local);
  }
  else {
    __result = (VariableSymbol **)BumpAllocator::allocate((BumpAllocator *)dst,this->len << 3,8);
    __first = begin(this);
    __last = end(this);
    std::
    uninitialized_copy<slang::ast::VariableSymbol_const*const*,slang::ast::VariableSymbol_const**>
              (__first,__last,__result);
    nonstd::span_lite::span<slang::ast::VariableSymbol_const*,18446744073709551615ul>::
    span<slang::ast::VariableSymbol_const**>
              ((span<slang::ast::VariableSymbol_const*,18446744073709551615ul> *)&this_local,
               __result,this->len);
  }
  return (int)this_local;
}

Assistant:

[[nodiscard]] span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::uninitialized_copy(begin(), end(), dest);

        return span<T>(dest, len);
    }